

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerBoundCheck(Lowerer *this,Instr *instr)

{
  OpCode OVar1;
  Func *func_00;
  code *pcVar2;
  bool bVar3;
  int32 iVar4;
  BailOutKind bailOutKindToLower;
  undefined4 *puVar5;
  Opnd *pOVar6;
  IntConstOpnd *pIVar7;
  LabelInstr *target;
  long lVar8;
  LabelInstr *target_00;
  IntConstOpnd *local_118;
  long local_d0;
  IntConstOpnd *local_c8;
  RegOpnd *addResultOpnd;
  LabelInstr *bailOutLabel;
  AutoReuseOpnd autoReuseAddResultOpnd;
  IntConstType newOffset;
  Opnd *tempOpnd;
  undefined1 uStack_68;
  undefined1 uStack_67;
  undefined6 uStack_66;
  OpCode compareOpCode;
  IntConstType offset;
  Func *func;
  IntConstOpnd *pIStack_50;
  bool doUnsignedCompare;
  IntConstOpnd *offsetOpnd;
  Opnd *rightOpnd;
  Opnd *leftOpnd;
  LabelInstr *pLStack_30;
  anon_class_1_0_00000001 VerifyLeftOrRightOpnd;
  Instr *insertBeforeInstr;
  LabelInstr *skipBailOutLabel;
  BailOutKind bailOutKind;
  int32 c;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3577,"(instr)","instr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((instr->m_opcode != BoundCheck) && (instr->m_opcode != UnsignedBoundCheck)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3578,
                       "(instr->m_opcode == Js::OpCode::BoundCheck || instr->m_opcode == Js::OpCode::UnsignedBoundCheck)"
                       ,
                       "instr->m_opcode == Js::OpCode::BoundCheck || instr->m_opcode == Js::OpCode::UnsignedBoundCheck"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (instr->m_opcode == UnsignedBoundCheck) {
    pOVar6 = IR::Instr::GetSrc1(instr);
    bVar3 = IR::Opnd::IsRegOpnd(pOVar6);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x357f,"(instr->GetSrc1()->IsRegOpnd())","instr->GetSrc1()->IsRegOpnd()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pOVar6 = IR::Instr::GetSrc1(instr);
    bVar3 = IR::Opnd::IsInt32(pOVar6);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3580,"(instr->GetSrc1()->IsInt32())","instr->GetSrc1()->IsInt32()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pOVar6 = IR::Instr::GetSrc2(instr);
    if (pOVar6 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3581,"(instr->GetSrc2())","instr->GetSrc2()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pOVar6 = IR::Instr::GetSrc2(instr);
    bVar3 = IR::Opnd::IsIntConstOpnd(pOVar6);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3582,"(!instr->GetSrc2()->IsIntConstOpnd())",
                         "!instr->GetSrc2()->IsIntConstOpnd()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pOVar6 = IR::Instr::GetDst(instr);
    if (pOVar6 != (Opnd *)0x0) {
      pOVar6 = IR::Instr::GetDst(instr);
      pIVar7 = IR::Opnd::AsIntConstOpnd(pOVar6);
      iVar4 = IR::IntConstOpnd::AsInt32(pIVar7);
      if ((iVar4 != 0) && (iVar4 != -1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3586,"(c == 0 || c == -1)","c == 0 || c == -1");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  bailOutKindToLower = IR::Instr::GetBailOutKind(instr);
  if ((((bailOutKindToLower != BailOutOnArrayAccessHelperCall) &&
       (bailOutKindToLower != BailOutOnInvalidatedArrayHeadSegment)) &&
      (bailOutKindToLower != BailOutOnFailedHoistedBoundCheck)) &&
     (bailOutKindToLower != BailOutOnFailedHoistedLoopCountBasedBoundCheck)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3590,
                       "(bailOutKind == IR::BailOutOnArrayAccessHelperCall || bailOutKind == IR::BailOutOnInvalidatedArrayHeadSegment || bailOutKind == IR::BailOutOnFailedHoistedBoundCheck || bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck)"
                       ,
                       "bailOutKind == IR::BailOutOnArrayAccessHelperCall || bailOutKind == IR::BailOutOnInvalidatedArrayHeadSegment || bailOutKind == IR::BailOutOnFailedHoistedBoundCheck || bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  target = IR::Instr::GetOrCreateContinueLabel(instr,false);
  LowerOneBailOutKind(this,instr,bailOutKindToLower,false,false);
  bVar3 = IR::Instr::HasBailOutInfo(instr);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3594,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pLStack_30 = (LabelInstr *)instr->m_next;
  rightOpnd = IR::Instr::UnlinkSrc1(instr);
  LowerBoundCheck::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&leftOpnd + 7),rightOpnd,false);
  pIVar7 = (IntConstOpnd *)IR::Instr::UnlinkSrc2(instr);
  LowerBoundCheck::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&leftOpnd + 7),(Opnd *)pIVar7,true);
  bVar3 = IR::Opnd::IsIntConstOpnd(rightOpnd);
  if ((bVar3) &&
     ((pIVar7 == (IntConstOpnd *)0x0 || (bVar3 = IR::Opnd::IsIntConstOpnd((Opnd *)pIVar7), bVar3))))
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x35ad,
                       "(!leftOpnd->IsIntConstOpnd() || rightOpnd && !rightOpnd->IsIntConstOpnd())",
                       "!leftOpnd->IsIntConstOpnd() || rightOpnd && !rightOpnd->IsIntConstOpnd()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pOVar6 = IR::Instr::GetDst(instr);
  if (pOVar6 == (Opnd *)0x0) {
    local_c8 = (IntConstOpnd *)0x0;
  }
  else {
    pOVar6 = IR::Instr::UnlinkDst(instr);
    local_c8 = IR::Opnd::AsIntConstOpnd(pOVar6);
  }
  pIStack_50 = local_c8;
  if ((local_c8 != (IntConstOpnd *)0x0) &&
     (lVar8 = IR::EncodableOpnd<long>::GetValue(&local_c8->super_EncodableOpnd<long>), lVar8 == 0))
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x35af,"(!offsetOpnd || offsetOpnd->GetValue() != 0)",
                       "!offsetOpnd || offsetOpnd->GetValue() != 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  OVar1 = instr->m_opcode;
  IR::Instr::Remove(instr);
  func_00 = (pLStack_30->super_Instr).m_func;
  if (local_c8 == (IntConstOpnd *)0x0) {
    local_d0 = 0;
  }
  else {
    local_d0 = IR::EncodableOpnd<long>::GetValue(&local_c8->super_EncodableOpnd<long>);
  }
  _uStack_68 = local_d0;
  tempOpnd._6_2_ = BrLe_A;
  bVar3 = IR::Opnd::IsIntConstOpnd(rightOpnd);
  offsetOpnd = pIVar7;
  if (((bVar3) && (bVar3 = IR::Opnd::IsRegOpnd((Opnd *)pIVar7), bVar3)) && (local_d0 != -0x80000000)
     ) {
    _uStack_68 = -local_d0;
    tempOpnd._6_2_ = BrGe_A;
    offsetOpnd = (IntConstOpnd *)rightOpnd;
    rightOpnd = (Opnd *)pIVar7;
  }
  bVar3 = IR::Opnd::IsIntConstOpnd(&offsetOpnd->super_Opnd);
  if (bVar3) {
    pIVar7 = IR::Opnd::AsIntConstOpnd(&offsetOpnd->super_Opnd);
    lVar8 = IR::EncodableOpnd<long>::GetValue(&pIVar7->super_EncodableOpnd<long>);
    bVar3 = IntConstMath::Add(_uStack_68,lVar8,TyInt32,
                              (IntConstType *)&autoReuseAddResultOpnd.autoDelete);
    if (!bVar3) {
      uStack_68 = autoReuseAddResultOpnd.autoDelete;
      uStack_67 = autoReuseAddResultOpnd.wasInUse;
      uStack_66 = autoReuseAddResultOpnd._18_6_;
      offsetOpnd = (IntConstOpnd *)0x0;
      pIStack_50 = (IntConstOpnd *)0x0;
    }
  }
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)&bailOutLabel);
  if ((_uStack_68 == -1) && (tempOpnd._6_2_ == BrLe_A)) {
    _uStack_68 = 0;
    tempOpnd._6_2_ = BrLt_A;
  }
  else if ((_uStack_68 == 1) && (tempOpnd._6_2_ == BrGe_A)) {
    _uStack_68 = 0;
    tempOpnd._6_2_ = BrGt_A;
  }
  else if ((_uStack_68 != 0) && (offsetOpnd != (IntConstOpnd *)0x0)) {
    target_00 = IR::Instr::GetOrCreateContinueLabel((pLStack_30->super_Instr).m_prev,true);
    pLStack_30 = target_00;
    if ((pIStack_50 != (IntConstOpnd *)0x0) &&
       (lVar8 = IR::EncodableOpnd<long>::GetValue(&pIStack_50->super_EncodableOpnd<long>),
       lVar8 != _uStack_68)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x35e3,"(!offsetOpnd || offsetOpnd->GetValue() == offset)",
                         "!offsetOpnd || offsetOpnd->GetValue() == offset");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pIVar7 = (IntConstOpnd *)IR::RegOpnd::New(TyInt32,func_00);
    IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)&bailOutLabel,(Opnd *)pIVar7,func_00,true);
    if (pIStack_50 == (IntConstOpnd *)0x0) {
      local_118 = IR::IntConstOpnd::New(_uStack_68,TyInt32,func_00,false);
    }
    else {
      local_118 = (IntConstOpnd *)IR::Opnd::UseWithNewType(&pIStack_50->super_Opnd,TyInt32,func_00);
    }
    InsertAdd(true,(Opnd *)pIVar7,&offsetOpnd->super_Opnd,&local_118->super_Opnd,
              &pLStack_30->super_Instr);
    InsertBranch(JO,target_00,&pLStack_30->super_Instr);
    offsetOpnd = pIVar7;
  }
  if (offsetOpnd == (IntConstOpnd *)0x0) {
    offsetOpnd = IR::IntConstOpnd::New(_uStack_68,TyInt32,func_00,false);
  }
  InsertCompareBranch(this,rightOpnd,&offsetOpnd->super_Opnd,tempOpnd._6_2_,
                      OVar1 == UnsignedBoundCheck,target,&pLStack_30->super_Instr,false);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&bailOutLabel);
  return;
}

Assistant:

void Lowerer::LowerBoundCheck(IR::Instr *const instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::BoundCheck || instr->m_opcode == Js::OpCode::UnsignedBoundCheck);

#if DBG
    if(instr->m_opcode == Js::OpCode::UnsignedBoundCheck)
    {
        // UnsignedBoundCheck is currently only supported for the pattern:
        //     UnsignedBoundCheck s1 <= s2 + c, where c == 0 || c == -1
        Assert(instr->GetSrc1()->IsRegOpnd());
        Assert(instr->GetSrc1()->IsInt32());
        Assert(instr->GetSrc2());
        Assert(!instr->GetSrc2()->IsIntConstOpnd());
        if(instr->GetDst())
        {
            const int32 c = instr->GetDst()->AsIntConstOpnd()->AsInt32();
            Assert(c == 0 || c == -1);
        }
    }
#endif

    const IR::BailOutKind bailOutKind = instr->GetBailOutKind();
    Assert(
        bailOutKind == IR::BailOutOnArrayAccessHelperCall ||
        bailOutKind == IR::BailOutOnInvalidatedArrayHeadSegment ||
        bailOutKind == IR::BailOutOnFailedHoistedBoundCheck ||
        bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck);

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(false);
    LowerOneBailOutKind(instr, bailOutKind, false);
    Assert(!instr->HasBailOutInfo());
    IR::Instr *insertBeforeInstr = instr->m_next;

#if DBG
    const auto VerifyLeftOrRightOpnd = [&](IR::Opnd *const opnd, const bool isRightOpnd)
    {
        if(!opnd)
        {
            Assert(isRightOpnd);
            return;
        }
        if(opnd->IsIntConstOpnd())
        {
            Assert(!isRightOpnd || opnd->AsIntConstOpnd()->GetValue() != 0);
            return;
        }
        Assert(opnd->GetType() == TyInt32 || opnd->GetType() == TyUint32);
    };
#endif

    // left <= right + offset (src1 <= src2 + dst)
    IR::Opnd *leftOpnd = instr->UnlinkSrc1();
    DebugOnly(VerifyLeftOrRightOpnd(leftOpnd, false));
    IR::Opnd *rightOpnd = instr->UnlinkSrc2();
    DebugOnly(VerifyLeftOrRightOpnd(rightOpnd, true));
    Assert(!leftOpnd->IsIntConstOpnd() || rightOpnd && !rightOpnd->IsIntConstOpnd());
    IR::IntConstOpnd *offsetOpnd = instr->GetDst() ? instr->UnlinkDst()->AsIntConstOpnd() : nullptr;
    Assert(!offsetOpnd || offsetOpnd->GetValue() != 0);
    const bool doUnsignedCompare = instr->m_opcode == Js::OpCode::UnsignedBoundCheck;
    instr->Remove();

    Func *const func = insertBeforeInstr->m_func;

    IntConstType offset = offsetOpnd ? offsetOpnd->GetValue() : 0;
    Js::OpCode compareOpCode = Js::OpCode::BrLe_A;
    if(leftOpnd->IsIntConstOpnd() && rightOpnd->IsRegOpnd() && offset != IntConstMin)
    {
        // Put the constants together: swap the operands, negate the offset, and invert the branch
        IR::Opnd *const tempOpnd = leftOpnd;
        leftOpnd = rightOpnd;
        rightOpnd = tempOpnd;
        offset = -offset;
        compareOpCode = Js::OpCode::BrGe_A;
    }

    if(rightOpnd->IsIntConstOpnd())
    {
        // Try to aggregate right + offset into a constant offset
        IntConstType newOffset;
        if(!IntConstMath::Add(offset, rightOpnd->AsIntConstOpnd()->GetValue(), TyInt32, &newOffset))
        {
            offset = newOffset;
            rightOpnd = nullptr;
            offsetOpnd = nullptr;
        }
    }

    // Determine if the Add for (right + offset) is necessary, and the op code that will be used for the comparison
    IR::AutoReuseOpnd autoReuseAddResultOpnd;
    if(offset == -1 && compareOpCode == Js::OpCode::BrLe_A)
    {
        offset = 0;
        compareOpCode = Js::OpCode::BrLt_A;
    }
    else if(offset == 1 && compareOpCode == Js::OpCode::BrGe_A)
    {
        offset = 0;
        compareOpCode = Js::OpCode::BrGt_A;
    }
    else if(offset != 0 && rightOpnd)
    {
        // Need to Add (right + offset). If it overflows, bail out.
        IR::LabelInstr *const bailOutLabel = insertBeforeInstr->m_prev->GetOrCreateContinueLabel(true);
        insertBeforeInstr = bailOutLabel;

        //     mov  temp, right
        //     add  temp, offset
        //     jo   $bailOut
        // $bailOut: (insertBeforeInstr)
        Assert(!offsetOpnd || offsetOpnd->GetValue() == offset);
        IR::RegOpnd *const addResultOpnd = IR::RegOpnd::New(TyInt32, func);
        autoReuseAddResultOpnd.Initialize(addResultOpnd, func);
        InsertAdd(
            true,
            addResultOpnd,
            rightOpnd,
            offsetOpnd ? offsetOpnd->UseWithNewType(TyInt32, func) : IR::IntConstOpnd::New(offset, TyInt32, func),
            insertBeforeInstr);
        InsertBranch(LowererMD::MDOverflowBranchOpcode, bailOutLabel, insertBeforeInstr);

        rightOpnd = addResultOpnd;
    }

    //     cmp  left, right
    //     jl[e] $skipBailOut
    // $bailOut:
    if(!rightOpnd)
    {
        rightOpnd = IR::IntConstOpnd::New(offset, TyInt32, func);
    }
    InsertCompareBranch(leftOpnd, rightOpnd, compareOpCode, doUnsignedCompare, skipBailOutLabel, insertBeforeInstr);
}